

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::HttpHeaders::Response> * __thiscall
kj::HttpHeaders::tryParseResponse
          (Maybe<kj::HttpHeaders::Response> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  byte *end;
  StringPtr SVar6;
  char *ptr;
  byte *local_58;
  char *local_50;
  char local_48;
  int *local_40;
  ulong local_38;
  
  uVar4 = content.size_;
  local_58 = (byte *)content.ptr;
  if ((1 < uVar4) && (local_58[uVar4 - 1] == 10)) {
    lVar2 = uVar4 - 1;
    if (local_58[uVar4 - 2] == 0xd) {
      lVar2 = uVar4 - 2;
    }
    end = local_58 + lVar2;
    local_58[~(ulong)(local_58[uVar4 - 2] == 0xd) + uVar4] = 0;
    consumeWord((char **)&local_58);
    if (((local_48 != '\0') && (5 < local_38)) &&
       ((char)local_40[1] == '/' && *local_40 == 0x50545448)) {
      for (; (bVar1 = *local_58, bVar1 == 9 || (bVar1 == 0x20)); local_58 = local_58 + 1) {
      }
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar5 = 0;
        do {
          uVar5 = ((uint)bVar1 + uVar5 * 10) - 0x30;
          bVar1 = local_58[1];
          local_58 = local_58 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        SVar6 = consumeLine((char **)&local_58);
        local_50 = SVar6.content.ptr;
        bVar3 = parseHeaders(this,(char *)local_58,(char *)end);
        if (bVar3) {
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.statusCode = uVar5;
          (__return_storage_ptr__->ptr).field_1.value.statusText.content.ptr = local_50;
          (__return_storage_ptr__->ptr).field_1.value.statusText.content.size_ = SVar6.content.size_
          ;
          return __return_storage_ptr__;
        }
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Response> HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_MAYBE(version, consumeWord(ptr)) {
    if (!version->startsWith("HTTP/")) return nullptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(code, consumeNumber(ptr)) {
    response.statusCode = *code;
  } else {
    return nullptr;
  }

  response.statusText = consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return response;
}